

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

void av1_tpl_row_mt_sync_write(AV1TplRowMultiThreadSync *tpl_row_mt_sync,int r,int c,int cols)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  
  bVar2 = cols + -1 <= c;
  iVar3 = c;
  if (bVar2) {
    iVar3 = tpl_row_mt_sync->sync_range + cols;
  }
  if (bVar2 || c % tpl_row_mt_sync->sync_range == 0) {
    pthread_mutex_lock((pthread_mutex_t *)(tpl_row_mt_sync->mutex_ + r));
    iVar1 = tpl_row_mt_sync->num_finished_cols[r];
    if (iVar3 < iVar1) {
      iVar3 = iVar1;
    }
    tpl_row_mt_sync->num_finished_cols[r] = iVar3;
    pthread_cond_signal((pthread_cond_t *)(tpl_row_mt_sync->cond_ + r));
    pthread_mutex_unlock((pthread_mutex_t *)(tpl_row_mt_sync->mutex_ + r));
    return;
  }
  return;
}

Assistant:

void av1_tpl_row_mt_sync_write(AV1TplRowMultiThreadSync *tpl_row_mt_sync, int r,
                               int c, int cols) {
#if CONFIG_MULTITHREAD
  int nsync = tpl_row_mt_sync->sync_range;
  int cur;
  // Only signal when there are enough encoded blocks for next row to run.
  int sig = 1;

  if (c < cols - 1) {
    cur = c;
    if (c % nsync) sig = 0;
  } else {
    cur = cols + nsync;
  }

  if (sig) {
    pthread_mutex_lock(&tpl_row_mt_sync->mutex_[r]);

    // When a thread encounters an error, num_finished_cols[r] is set to maximum
    // column number. In this case, the AOMMAX operation here ensures that
    // num_finished_cols[r] is not overwritten with a smaller value thus
    // preventing the infinite waiting of threads in the relevant sync_read()
    // function.
    tpl_row_mt_sync->num_finished_cols[r] =
        AOMMAX(tpl_row_mt_sync->num_finished_cols[r], cur);

    pthread_cond_signal(&tpl_row_mt_sync->cond_[r]);
    pthread_mutex_unlock(&tpl_row_mt_sync->mutex_[r]);
  }
#else
  (void)tpl_row_mt_sync;
  (void)r;
  (void)c;
  (void)cols;
#endif  // CONFIG_MULTITHREAD
}